

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O2

uint aom_avg_8x8_sse2(uint8_t *s,int p)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  lVar1 = (long)p;
  auVar2._8_8_ = *(undefined8 *)(s + lVar1);
  auVar2._0_8_ = *(undefined8 *)s;
  auVar3._8_8_ = *(undefined8 *)(s + lVar1 * 3);
  auVar3._0_8_ = *(undefined8 *)(s + lVar1 * 2);
  auVar4._8_8_ = *(undefined8 *)(s + lVar1 * 5);
  auVar4._0_8_ = *(undefined8 *)(s + lVar1 * 4);
  auVar5._8_8_ = *(undefined8 *)(s + lVar1 * 7);
  auVar5._0_8_ = *(undefined8 *)(s + lVar1 * 6);
  auVar2 = psadbw(auVar2,(undefined1  [16])0x0);
  auVar3 = psadbw(auVar3,(undefined1  [16])0x0);
  auVar4 = psadbw(auVar4,(undefined1  [16])0x0);
  auVar5 = psadbw(auVar5,(undefined1  [16])0x0);
  return CONCAT22(auVar5._10_2_ + auVar4._10_2_ + auVar3._10_2_ + auVar2._10_2_ +
                  auVar5._2_2_ + auVar4._2_2_ + auVar3._2_2_ + auVar2._2_2_,
                  auVar5._8_2_ + auVar4._8_2_ + auVar3._8_2_ + auVar2._8_2_ +
                  auVar5._0_2_ + auVar4._0_2_ + auVar3._0_2_ + auVar2._0_2_) + 0x20U >> 6;
}

Assistant:

unsigned int aom_avg_8x8_sse2(const uint8_t *s, int p) {
  __m128i sum0, sum1, s0, s1, s2, s3, u0;
  unsigned int avg = 0;
  u0 = _mm_setzero_si128();
  s0 = loadh_epi64((const __m128i *)(s + p),
                   _mm_loadl_epi64((const __m128i *)(s)));
  s1 = loadh_epi64((const __m128i *)(s + 3 * p),
                   _mm_loadl_epi64((const __m128i *)(s + 2 * p)));
  s2 = loadh_epi64((const __m128i *)(s + 5 * p),
                   _mm_loadl_epi64((const __m128i *)(s + 4 * p)));
  s3 = loadh_epi64((const __m128i *)(s + 7 * p),
                   _mm_loadl_epi64((const __m128i *)(s + 6 * p)));
  s0 = _mm_sad_epu8(s0, u0);
  s1 = _mm_sad_epu8(s1, u0);
  s2 = _mm_sad_epu8(s2, u0);
  s3 = _mm_sad_epu8(s3, u0);

  sum0 = _mm_add_epi16(s0, s1);
  sum1 = _mm_add_epi16(s2, s3);
  sum0 = _mm_add_epi16(sum0, sum1);
  sum0 = _mm_add_epi16(sum0, _mm_srli_si128(sum0, 8));
  avg = _mm_cvtsi128_si32(sum0);
  return (avg + 32) >> 6;
}